

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

bool MyGame::Example::VerifyAnyUniqueAliases(Verifier *verifier,void *obj,AnyUniqueAliases type)

{
  Monster *ptr_2;
  TestSimpleTableWithEnum *ptr_1;
  Monster *ptr;
  AnyUniqueAliases type_local;
  void *obj_local;
  Verifier *verifier_local;
  
  switch(type) {
  case AnyUniqueAliases_MIN:
    verifier_local._7_1_ = true;
    break;
  case AnyUniqueAliases_M:
    verifier_local._7_1_ =
         flatbuffers::VerifierTemplate<false>::VerifyTable<MyGame::Example::Monster>
                   (verifier,(Monster *)obj);
    break;
  case AnyUniqueAliases_TS:
    verifier_local._7_1_ =
         flatbuffers::VerifierTemplate<false>::VerifyTable<MyGame::Example::TestSimpleTableWithEnum>
                   (verifier,(TestSimpleTableWithEnum *)obj);
    break;
  case AnyUniqueAliases_M2:
    verifier_local._7_1_ =
         flatbuffers::VerifierTemplate<false>::VerifyTable<MyGame::Example2::Monster>
                   (verifier,(Monster *)obj);
    break;
  default:
    verifier_local._7_1_ = true;
  }
  return verifier_local._7_1_;
}

Assistant:

inline bool VerifyAnyUniqueAliases(::flatbuffers::Verifier &verifier, const void *obj, AnyUniqueAliases type) {
  switch (type) {
    case AnyUniqueAliases_NONE: {
      return true;
    }
    case AnyUniqueAliases_M: {
      auto ptr = reinterpret_cast<const MyGame::Example::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_TS: {
      auto ptr = reinterpret_cast<const MyGame::Example::TestSimpleTableWithEnum *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_M2: {
      auto ptr = reinterpret_cast<const MyGame::Example2::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    default: return true;
  }
}